

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeTest_TERM(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprPhrase *pFVar1;
  Fts5IndexIter *pFVar2;
  Fts5IndexIter *pIter;
  Fts5ExprPhrase *pPhrase;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  pFVar1 = pNode->pNear->apPhrase[0];
  pFVar2 = pFVar1->aTerm[0].pIter;
  (pFVar1->poslist).n = pFVar2->nData;
  if (pExpr->pConfig->eDetail == 0) {
    (pFVar1->poslist).p = pFVar2->pData;
  }
  pNode->iRowid = pFVar2->iRowid;
  pNode->bNomatch = (uint)((pFVar1->poslist).n == 0);
  return 0;
}

Assistant:

static int fts5ExprNodeTest_TERM(
  Fts5Expr *pExpr,                /* Expression that pNear is a part of */
  Fts5ExprNode *pNode             /* The "NEAR" node (FTS5_TERM) */
){
  /* As this "NEAR" object is actually a single phrase that consists 
  ** of a single term only, grab pointers into the poslist managed by the
  ** fts5_index.c iterator object. This is much faster than synthesizing 
  ** a new poslist the way we have to for more complicated phrase or NEAR
  ** expressions.  */
  Fts5ExprPhrase *pPhrase = pNode->pNear->apPhrase[0];
  Fts5IndexIter *pIter = pPhrase->aTerm[0].pIter;

  assert( pNode->eType==FTS5_TERM );
  assert( pNode->pNear->nPhrase==1 && pPhrase->nTerm==1 );
  assert( pPhrase->aTerm[0].pSynonym==0 );

  pPhrase->poslist.n = pIter->nData;
  if( pExpr->pConfig->eDetail==FTS5_DETAIL_FULL ){
    pPhrase->poslist.p = (u8*)pIter->pData;
  }
  pNode->iRowid = pIter->iRowid;
  pNode->bNomatch = (pPhrase->poslist.n==0);
  return SQLITE_OK;
}